

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * cmTargetPropertyComputer::ComputeLocation<cmTarget>(cmTarget *tgt,string *config)

{
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *this;
  cmGeneratorTarget *this_00;
  string sStack_38;
  
  if (ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_ == '\0'
     ) {
    iVar2 = __cxa_guard_acquire(&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)
                                 ::loc_abi_cxx11_);
    if (iVar2 != 0) {
      ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                     loc_abi_cxx11_.field_2;
      ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_.
      _M_string_length = 0;
      ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_.field_2
      ._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                    loc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                           loc_abi_cxx11_);
    }
  }
  bVar1 = cmTarget::IsImported(tgt);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&sStack_38,tgt,config,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&sStack_38);
  }
  else {
    this = cmTarget::GetGlobalGenerator(tgt);
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
    }
    this_00 = cmGlobalGenerator::FindGeneratorTarget
                        (this,&((tgt->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Name);
    cmGeneratorTarget::GetFullPath(&sStack_38,this_00,config,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&sStack_38);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_;
}

Assistant:

const std::string& cmTargetPropertyComputer::ComputeLocation<cmTarget>(
  cmTarget const* tgt, const std::string& config)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc =
      tgt->ImportedGetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
    return loc;
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  return loc;
}